

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBar::wheelEvent(QScrollBar *this,QWheelEvent *event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Orientation OVar4;
  uint uVar5;
  ScrollPhase SVar6;
  QPoint QVar7;
  QScrollBarPrivate *this_00;
  socklen_t *__addr_len;
  sockaddr *__addr;
  QEvent *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  QScrollBarPrivate *d;
  int delta;
  bool horizontal;
  QWheelEvent *in_stack_ffffffffffffff80;
  undefined1 value;
  uint uVar9;
  QPoint in_stack_ffffffffffffffc8;
  int local_18;
  QFlagsStorage<Qt::KeyboardModifier> modifiers;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QEvent::ignore(in_RSI);
  QVar7 = QWheelEvent::angleDelta(in_stack_ffffffffffffff80);
  modifiers.i = (Int)QVar7.xp.m_i;
  local_c = QPoint::x((QPoint *)0x67c9f3);
  iVar2 = qAbs<int>(&local_c);
  QWheelEvent::angleDelta(in_stack_ffffffffffffff80);
  local_18 = QPoint::y((QPoint *)0x67ca1e);
  iVar3 = qAbs<int>(&local_18);
  bVar1 = iVar3 < iVar2;
  bVar8 = false;
  if (!bVar1) {
    QWheelEvent::angleDelta(in_stack_ffffffffffffff80);
    iVar2 = QPoint::x((QPoint *)0x67ca63);
    bVar8 = false;
    if (iVar2 != 0) {
      OVar4 = QAbstractSlider::orientation((QAbstractSlider *)in_stack_ffffffffffffff80);
      bVar8 = OVar4 == Horizontal;
    }
  }
  if (!bVar8) {
    if (bVar1) {
      QWheelEvent::angleDelta(in_stack_ffffffffffffff80);
      iVar2 = QPoint::x((QPoint *)0x67cab3);
      uVar5 = -iVar2;
    }
    else {
      in_stack_ffffffffffffffc8 = QWheelEvent::angleDelta(in_stack_ffffffffffffff80);
      uVar5 = QPoint::y((QPoint *)0x67cad8);
    }
    uVar9 = uVar5;
    this_00 = d_func((QScrollBar *)0x67caee);
    iVar2 = 2;
    if (bVar1) {
      iVar2 = 1;
    }
    QInputEvent::modifiers((QInputEvent *)this_00);
    value = (undefined1)((ulong)this_00 >> 0x38);
    __addr_len = (socklen_t *)(ulong)uVar5;
    iVar3 = iVar2;
    bVar1 = QAbstractSliderPrivate::scrollByDelta
                      ((QAbstractSliderPrivate *)in_stack_ffffffffffffffc8,
                       (Orientation)((ulong)in_RDI >> 0x20),(KeyboardModifiers)modifiers.i,
                       (int)in_RDI);
    if (bVar1) {
      QEvent::accept(in_RSI,iVar2,__addr,__addr_len);
    }
    SVar6 = QWheelEvent::phase((QWheelEvent *)in_RSI);
    if (SVar6 == ScrollBegin) {
      QScrollBarPrivate::setTransient((QScrollBarPrivate *)CONCAT44(uVar9,iVar3),(bool)value);
    }
    else {
      SVar6 = QWheelEvent::phase((QWheelEvent *)in_RSI);
      if (SVar6 == ScrollEnd) {
        QScrollBarPrivate::setTransient((QScrollBarPrivate *)CONCAT44(uVar9,iVar3),(bool)value);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::wheelEvent(QWheelEvent *event)
{
    event->ignore();
    bool horizontal = qAbs(event->angleDelta().x()) > qAbs(event->angleDelta().y());
    // The vertical wheel can be used to scroll a horizontal scrollbar, but only if
    // there is no simultaneous horizontal wheel movement.  This is to avoid chaotic
    // scrolling on touchpads.
    if (!horizontal && event->angleDelta().x() != 0 && orientation() == Qt::Horizontal)
        return;
    // scrollbar is a special case - in vertical mode it reaches minimum
    // value in the upper position, however QSlider's minimum value is on
    // the bottom. So we need to invert the value, but since the scrollbar is
    // inverted by default, we need to invert the delta value only for the
    // horizontal orientation.
    int delta = horizontal ? -event->angleDelta().x() : event->angleDelta().y();
    Q_D(QScrollBar);
    if (d->scrollByDelta(horizontal ? Qt::Horizontal : Qt::Vertical, event->modifiers(), delta))
        event->accept();

    if (event->phase() == Qt::ScrollBegin)
        d->setTransient(false);
    else if (event->phase() == Qt::ScrollEnd)
        d->setTransient(true);
}